

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::RgbaInputFile::RgbaInputFile
          (RgbaInputFile *this,IStream *is,string *layerName,int numThreads)

{
  RgbaChannels rgbaChannels;
  InputFile *this_00;
  Header *header;
  FromYca *this_01;
  
  this->_vptr_RgbaInputFile = (_func_int **)&PTR__RgbaInputFile_00366298;
  this_00 = (InputFile *)operator_new(0x10);
  InputFile::InputFile(this_00,is,numThreads);
  this->_inputFile = this_00;
  this->_fromYca = (FromYca *)0x0;
  header = InputFile::header(this_00);
  anon_unknown_1::prefixFromLayerName(&this->_channelNamePrefix,layerName,header);
  rgbaChannels = channels(this);
  if (WRITE_RGBA < rgbaChannels) {
    this_01 = (FromYca *)operator_new(0x188);
    FromYca::FromYca(this_01,this->_inputFile,rgbaChannels);
    this->_fromYca = this_01;
  }
  return;
}

Assistant:

RgbaInputFile::RgbaInputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is,
			      const string &layerName,
			      int numThreads)
:
    _inputFile (new InputFile (is, numThreads)),
    _fromYca (0),
    _channelNamePrefix (prefixFromLayerName (layerName, _inputFile->header()))
{
    RgbaChannels rgbaChannels = channels();

    if (rgbaChannels & (WRITE_Y | WRITE_C))
	_fromYca = new FromYca (*_inputFile, rgbaChannels);
}